

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

GCstr * lj_ctype_repr_complex(lua_State *L,void *sp,CTSize size)

{
  uint64_t uVar1;
  SBuf *sb_00;
  GCstr *pGVar2;
  int c;
  double local_60;
  TValue im;
  TValue re;
  SBuf *sb;
  CTSize size_local;
  void *sp_local;
  lua_State *L_local;
  SBuf *sb_1;
  
  uVar1 = (L->glref).ptr64;
  sb_00 = (SBuf *)(uVar1 + 200);
  *(lua_State **)(uVar1 + 0xe0) = L;
  sb_00->w = *(char **)(uVar1 + 0xd8);
  if (size == 0x10) {
    im = *sp;
    local_60 = *(double *)((long)sp + 8);
  }
  else {
    im.n = (lua_Number)*sp;
    local_60 = (double)*(float *)((long)sp + 4);
  }
  lj_strfmt_putfnum(sb_00,0xf000035,im.n);
  if ((((ulong)local_60 & 0x8000000000000000) == 0) || (NAN(local_60))) {
    lj_buf_putchar(sb_00,0x2b);
  }
  lj_strfmt_putfnum(sb_00,0xf000035,local_60);
  c = 0x69;
  if ('`' < sb_00->w[-1]) {
    c = 0x49;
  }
  lj_buf_putchar(sb_00,c);
  pGVar2 = lj_str_new(L,*(char **)(uVar1 + 0xd8),
                      (ulong)(uint)((int)sb_00->w - (int)*(undefined8 *)(uVar1 + 0xd8)));
  return pGVar2;
}

Assistant:

GCstr *lj_ctype_repr_complex(lua_State *L, void *sp, CTSize size)
{
  SBuf *sb = lj_buf_tmp_(L);
  TValue re, im;
  if (size == 2*sizeof(double)) {
    re.n = *(double *)sp; im.n = ((double *)sp)[1];
  } else {
    re.n = (double)*(float *)sp; im.n = (double)((float *)sp)[1];
  }
  lj_strfmt_putfnum(sb, STRFMT_G14, re.n);
  if (!(im.u32.hi & 0x80000000u) || im.n != im.n) lj_buf_putchar(sb, '+');
  lj_strfmt_putfnum(sb, STRFMT_G14, im.n);
  lj_buf_putchar(sb, sb->w[-1] >= 'a' ? 'I' : 'i');
  return lj_buf_str(L, sb);
}